

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

int64_t __thiscall
aeron::ClientConductor::addPublication(ClientConductor *this,string *channel,int32_t streamId)

{
  PublicationStateDefn *pPVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  pthread_mutex_t *__mutex;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  __it;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  __it_00;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  _Var6;
  undefined1 *puVar7;
  int64_t registrationId;
  int32_t local_ec;
  string *local_e8;
  pthread_mutex_t *local_e0;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  int32_t local_b8;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  int32_t local_90;
  PublicationStateDefn *local_88;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  int32_t local_60;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  int32_t local_38;
  
  local_ec = streamId;
  verifyDriverIsActive(this);
  ensureOpen(this);
  __mutex = (pthread_mutex_t *)&this->m_adminLock;
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  __it._M_current =
       (this->m_publications).
       super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->m_publications).
           super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_80 = local_70;
  pcVar2 = (channel->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar2,pcVar2 + channel->_M_string_length);
  local_60 = local_ec;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_80,local_80 + local_78);
  local_38 = local_60;
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_58,local_58 + local_50);
  local_b8 = local_38;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_d8,local_d8 + local_d0);
  local_90 = local_b8;
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_b0,local_b0 + local_a8);
  local_b8 = local_90;
  lVar5 = ((long)pPVar1 - (long)__it._M_current >> 4) * -0x71c71c71c71c71c7 >> 2;
  __it_00._M_current = __it._M_current;
  local_88 = pPVar1;
  if (0 < lVar5) {
    __it_00._M_current = __it._M_current + lVar5 * 4;
    lVar5 = lVar5 + 1;
    local_e8 = channel;
    local_e0 = __mutex;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
              ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                            *)&local_d8,__it);
      __mutex = local_e0;
      _Var6._M_current = __it._M_current;
      channel = local_e8;
      if (bVar3) goto LAB_0013e599;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
              ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                            *)&local_d8,__it._M_current + 1);
      __mutex = local_e0;
      _Var6._M_current = __it._M_current + 1;
      channel = local_e8;
      if (bVar3) goto LAB_0013e599;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
              ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                            *)&local_d8,__it._M_current + 2);
      __mutex = local_e0;
      _Var6._M_current = __it._M_current + 2;
      channel = local_e8;
      if (bVar3) goto LAB_0013e599;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
              ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                            *)&local_d8,__it._M_current + 3);
      __mutex = local_e0;
      _Var6._M_current = __it._M_current + 3;
      channel = local_e8;
      if (bVar3) goto LAB_0013e599;
      __it._M_current = __it._M_current + 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  pPVar1 = local_88;
  lVar5 = ((long)local_88 - (long)__it_00._M_current >> 4) * -0x71c71c71c71c71c7;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var6._M_current = pPVar1;
      if ((lVar5 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
                  ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                                *)&local_d8,__it_00), _Var6._M_current = __it_00._M_current, bVar3))
      goto LAB_0013e599;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
            ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                          *)&local_d8,__it_00);
    _Var6._M_current = __it_00._M_current;
    if (bVar3) goto LAB_0013e599;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>::
          operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                      *)&local_d8,__it_00);
  _Var6._M_current = pPVar1;
  if (bVar3) {
    _Var6._M_current = __it_00._M_current;
  }
LAB_0013e599:
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (_Var6._M_current ==
      (this->m_publications).
      super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_d8 = (undefined1 *)DriverProxy::addPublication(this->m_driverProxy,channel,local_ec);
    if ((this->m_epochClock).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    local_b0 = (undefined1 *)(*(this->m_epochClock)._M_invoker)((_Any_data *)&this->m_epochClock);
    std::
    vector<aeron::ClientConductor::PublicationStateDefn,std::allocator<aeron::ClientConductor::PublicationStateDefn>>
    ::emplace_back<std::__cxx11::string_const&,long&,int&,long_long>
              ((vector<aeron::ClientConductor::PublicationStateDefn,std::allocator<aeron::ClientConductor::PublicationStateDefn>>
                *)&this->m_publications,channel,(long *)&local_d8,&local_ec,(longlong *)&local_b0);
    puVar7 = local_d8;
  }
  else {
    puVar7 = (undefined1 *)(_Var6._M_current)->m_registrationId;
  }
  pthread_mutex_unlock(__mutex);
  return (int64_t)puVar7;
}

Assistant:

std::int64_t ClientConductor::addPublication(const std::string &channel, std::int32_t streamId)
{
    verifyDriverIsActive();
    ensureOpen();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);
    std::int64_t id;

    auto it = std::find_if(m_publications.begin(), m_publications.end(),
        [channel, streamId](const PublicationStateDefn &entry)
        {
            return (streamId == entry.m_streamId && channel == entry.m_channel);
        });

    if (it == m_publications.end())
    {
        std::int64_t registrationId = m_driverProxy.addPublication(channel, streamId);

        m_publications.emplace_back(channel, registrationId, streamId, m_epochClock());
        id = registrationId;
    }
    else
    {
        id = (*it).m_registrationId;
    }

    return id;
}